

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

int lws_client_http_multipart
              (lws *wsi,char *name,char *filename,char *content_type,char **p,char *end)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t size;
  int iVar5;
  
  if (((wsi->http).field_0x88 & 8) != 0) {
    iVar5 = (int)end;
    iVar3 = (int)p;
    if (name == (char *)0x0) {
      uVar4 = 0;
      iVar3 = lws_snprintf(*p,(long)(iVar5 - iVar3),"\r\n--%s--\r\n",(wsi->http).multipart_boundary)
      ;
      *p = *p + iVar3;
    }
    else {
      if ((wsi->field_0x2e3 & 2) != 0) {
        iVar2 = lws_snprintf(*p,(long)(iVar5 - iVar3),"\r\n");
        *p = *p + iVar2;
      }
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc | 0x200000000000000;
      size = (size_t)(iVar5 - iVar3);
      iVar3 = lws_snprintf(*p,size,"--%s\r\nContent-Disposition: form-data; name=\"%s\"",
                           (wsi->http).multipart_boundary,name);
      pcVar1 = *p;
      *p = pcVar1 + iVar3;
      if (filename != (char *)0x0) {
        iVar3 = lws_snprintf(pcVar1 + iVar3,size,"; filename=\"%s\"",filename);
        *p = *p + iVar3;
      }
      if (content_type != (char *)0x0) {
        iVar3 = lws_snprintf(*p,size,"\r\nContent-Type: %s");
        *p = *p + iVar3;
      }
      iVar3 = lws_snprintf(*p,size,"\r\n\r\n");
      pcVar1 = *p;
      *p = pcVar1 + iVar3;
      uVar4 = (uint)(pcVar1 + iVar3 == end);
    }
    return uVar4;
  }
  __assert_fail("wsi->http.multipart",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/client/client-http.c"
                ,0x3a7,
                "int lws_client_http_multipart(struct lws *, const char *, const char *, const char *, char **, char *)"
               );
}

Assistant:

int
lws_client_http_multipart(struct lws *wsi, const char *name,
			  const char *filename, const char *content_type,
			  char **p, char *end)
{
	/*
	 * Client conn must have been created with LCCSCF_HTTP_MULTIPART_MIME
	 * flag to use this api
	 */
	assert(wsi->http.multipart);

	if (!name) {
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
					"\xd\xa--%s--\xd\xa",
					wsi->http.multipart_boundary);

		return 0;
	}

	if (wsi->client_subsequent_mime_part)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa");
	wsi->client_subsequent_mime_part = 1;

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "--%s\xd\xa"
				    "Content-Disposition: form-data; "
				      "name=\"%s\"",
				      wsi->http.multipart_boundary, name);
	if (filename)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p),
				   "; filename=\"%s\"", filename);

	if (content_type)
		*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa"
				"Content-Type: %s", content_type);

	*p += lws_snprintf((char *)(*p), lws_ptr_diff(end, p), "\xd\xa\xd\xa");

	return *p == end;
}